

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

int32_t icu_63::CollationBuilder::countTailoredNodes(int64_t *nodesArray,int32_t i,int32_t strength)

{
  int32_t count;
  uint uVar1;
  uint uVar2;
  
  count = 0;
  while( true ) {
    if (i == 0) {
      return count;
    }
    uVar2 = (uint)nodesArray[i];
    uVar1 = uVar2 & 3;
    if ((int)uVar1 < strength) break;
    if (uVar1 == strength) {
      if ((nodesArray[i] & 8U) == 0) {
        return count;
      }
      count = count + 1;
    }
    i = uVar2 >> 8 & 0xfffff;
  }
  return count;
}

Assistant:

int32_t
CollationBuilder::countTailoredNodes(const int64_t *nodesArray, int32_t i, int32_t strength) {
    int32_t count = 0;
    for(;;) {
        if(i == 0) { break; }
        int64_t node = nodesArray[i];
        if(strengthFromNode(node) < strength) { break; }
        if(strengthFromNode(node) == strength) {
            if(isTailoredNode(node)) {
                ++count;
            } else {
                break;
            }
        }
        i = nextIndexFromNode(node);
    }
    return count;
}